

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  CallInfo *pCVar1;
  int iVar2;
  CallInfo *pCVar3;
  
  pCVar1 = L->ci;
  pCVar3 = pCVar1;
  while (0 < level) {
    if (pCVar3 <= L->base_ci) {
      return 0;
    }
    level = level + -1;
    if ((((pCVar3->func->value).gc)->h).flags == '\0') {
      level = level - pCVar3->tailcalls;
    }
    pCVar3 = pCVar3 + -1;
    pCVar1 = pCVar1 + -1;
  }
  iVar2 = 0;
  if (level == 0) {
    if (pCVar3 <= L->base_ci) {
      return 0;
    }
    iVar2 = (int)(((long)pCVar1 - (long)L->base_ci) / 0x28);
  }
  ar->i_ci = iVar2;
  return 1;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci > L->base_ci; ci--) {
    level--;
    if (f_isLua(ci))  /* Lua function? */
      level -= ci->tailcalls;  /* skip lost tail calls */
  }
  if (level == 0 && ci > L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = cast_int(ci - L->base_ci);
  }
  else if (level < 0) {  /* level is of a lost tail call? */
    status = 1;
    ar->i_ci = 0;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}